

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

bool __thiscall
Inline::InlineCallBuiltInTarget
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,
          FunctionJITTimeInfo *inlineeData,FunctionJITTimeInfo *callFuncInfo,
          Instr *callTargetLdInstr,OpCode inlineOpCode,StackSym *symThis,uint recursiveInlineDepth,
          bool isCallInstanceFunction,Instr **returnInstr)

{
  code *pcVar1;
  FunctionJITTimeInfo *this_00;
  bool bVar2;
  Opnd *pOVar3;
  ProfiledInstr *pPVar4;
  Instr *pIVar5;
  undefined4 *puVar6;
  bool local_71;
  ProfileId callSiteId;
  Instr *pIStack_70;
  bool isInlined;
  Instr *unused;
  ByteCodeUsesInstr *useCallTargetInstr;
  bool safeThis;
  StackSym *pSStack_58;
  bool originalCallTargetOpndJITOpt;
  StackSym *originalCallTargetStackSym;
  OpCode originalCallOpCode;
  Instr *pIStack_48;
  bool isCallInstanceFunction_local;
  Instr *callTargetLdInstr_local;
  FunctionJITTimeInfo *callFuncInfo_local;
  FunctionJITTimeInfo *inlineeData_local;
  FunctionJITTimeInfo *inlinerData_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  originalCallTargetStackSym._7_1_ = isCallInstanceFunction;
  originalCallTargetStackSym._4_2_ = callInstr->m_opcode;
  pIStack_48 = callTargetLdInstr;
  callTargetLdInstr_local = (Instr *)callFuncInfo;
  callFuncInfo_local = inlineeData;
  inlineeData_local = inlinerData;
  inlinerData_local = (FunctionJITTimeInfo *)callInstr;
  callInstr_local = (Instr *)this;
  pOVar3 = IR::Instr::GetSrc1(callInstr);
  pSStack_58 = IR::Opnd::GetStackSym(pOVar3);
  pOVar3 = IR::Instr::GetSrc1((Instr *)inlinerData_local);
  useCallTargetInstr._7_1_ = IR::Opnd::GetIsJITOptimizedReg(pOVar3);
  useCallTargetInstr._6_1_ = 0;
  bVar2 = TryOptimizeCallInstrWithFixedMethod
                    (this,(Instr *)inlinerData_local,(FunctionJITTimeInfo *)callTargetLdInstr_local,
                     false,true,false,true,(bool *)((long)&useCallTargetInstr + 6),false,0);
  if (bVar2) {
    unused = &IR::ByteCodeUsesInstr::New((Instr *)inlinerData_local)->super_Instr;
    IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
              ((ByteCodeUsesInstr *)unused,(bool)(useCallTargetInstr._7_1_ & 1),
               (pSStack_58->super_Sym).m_id);
    IR::Instr::InsertBefore((Instr *)inlinerData_local,unused);
    this_00 = inlinerData_local;
    *(OpCode *)&(inlinerData_local->m_data).inlineeCount = originalCallTargetStackSym._4_2_;
    pOVar3 = IR::Instr::GetDst(pIStack_48);
    IR::Instr::ReplaceSrc1((Instr *)this_00,pOVar3);
    pIStack_70 = (Instr *)0x0;
    AdjustArgoutsForCallTargetInlining
              (this,(Instr *)inlinerData_local,&stack0xffffffffffffff90,
               (bool)(originalCallTargetStackSym._7_1_ & 1));
    local_71 = false;
    pPVar4 = IR::Instr::AsProfiledInstr((Instr *)inlinerData_local);
    pIVar5 = InlineBuiltInFunction
                       (this,(Instr *)inlinerData_local,callFuncInfo_local,inlineOpCode,
                        inlineeData_local,symThis,&local_71,(pPVar4->u).profileId & 0xffff,
                        recursiveInlineDepth,unused);
    *returnInstr = pIVar5;
    if ((local_71 & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xdd3,"(isInlined)","isInlined");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Inline::InlineCallBuiltInTarget(IR::Instr *callInstr, const FunctionJITTimeInfo* inlinerData, const FunctionJITTimeInfo* inlineeData, const FunctionJITTimeInfo *callFuncInfo, IR::Instr * callTargetLdInstr, Js::OpCode inlineOpCode,
    const StackSym *symThis, uint recursiveInlineDepth, bool isCallInstanceFunction, IR::Instr ** returnInstr)
{
    Js::OpCode originalCallOpCode = callInstr->m_opcode;
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    bool safeThis = false;
    if (!TryOptimizeCallInstrWithFixedMethod(callInstr, callFuncInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/, safeThis))
    {
        return false;
    }

    IR::ByteCodeUsesInstr * useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr);
    useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndJITOpt, originalCallTargetStackSym->m_id);
    callInstr->InsertBefore(useCallTargetInstr);

    callInstr->m_opcode = originalCallOpCode;
    callInstr->ReplaceSrc1(callTargetLdInstr->GetDst());

    IR::Instr * unused = nullptr;
    AdjustArgoutsForCallTargetInlining(callInstr, &unused, isCallInstanceFunction);

    bool isInlined = false;
    Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);
    *returnInstr = InlineBuiltInFunction(callInstr, inlineeData, inlineOpCode, inlinerData, symThis, &isInlined, callSiteId, recursiveInlineDepth, useCallTargetInstr);
    Assert(isInlined);

    return true;
}